

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O3

void Hacl_Hash_SHA3_update_last_sha3
               (Spec_Hash_Definitions_hash_alg a,uint64_t *s,uint8_t *input,uint32_t input_len)

{
  ulong __n;
  uint32_t uVar1;
  byte bVar2;
  uint32_t i;
  long lVar3;
  uint8_t b2 [256];
  uint8_t b1 [256];
  ulong local_338 [25];
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  uint8_t local_238 [256];
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar2 = 6;
  if ((a & 0xfe) == 0xc) {
    bVar2 = 0x1f;
  }
  uVar1 = block_len(a);
  if (uVar1 == input_len) {
    lVar3 = 0;
    memset(&local_138,0,0x100);
    memcpy(&local_138,input,(ulong)input_len);
    absorb_inner_32((uint8_t *)&local_138,s);
    local_338[0] = (ulong)bVar2;
    memset(local_338 + 1,0,0xf8);
    do {
      s[lVar3] = s[lVar3] ^ local_338[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x19);
    memset(local_238,0,0x100);
    local_238[(ulong)input_len - 1] = 0x80;
  }
  else {
    lVar3 = 0;
    memset(&local_138,0,0x100);
    __n = (ulong)input_len % (ulong)uVar1;
    memcpy(&local_138,input + (input_len - __n),__n);
    *(byte *)((long)&local_138 + __n) = bVar2;
    local_338[0] = local_138;
    local_338[1] = uStack_130;
    local_338[2] = local_128;
    local_338[3] = uStack_120;
    local_338[4] = local_118;
    local_338[5] = uStack_110;
    local_338[6] = local_108;
    local_338[7] = uStack_100;
    local_338[8] = local_f8;
    local_338[9] = uStack_f0;
    local_338[10] = local_e8;
    local_338[0xb] = uStack_e0;
    local_338[0xc] = local_d8;
    local_338[0xd] = uStack_d0;
    local_338[0xe] = local_c8;
    local_338[0xf] = uStack_c0;
    local_338[0x10] = local_b8;
    local_338[0x11] = uStack_b0;
    local_338[0x12] = local_a8;
    local_338[0x13] = uStack_a0;
    local_338[0x14] = local_98;
    local_338[0x15] = uStack_90;
    local_338[0x16] = local_88;
    local_338[0x17] = uStack_80;
    local_338[0x18] = local_78;
    uStack_270 = uStack_70;
    local_268 = local_68;
    uStack_260 = uStack_60;
    local_258 = local_58;
    uStack_250 = uStack_50;
    local_248 = local_48;
    uStack_240 = uStack_40;
    do {
      s[lVar3] = s[lVar3] ^ local_338[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x19);
    memset(local_238,0,0x100);
    local_238[(ulong)uVar1 - 1] = 0x80;
  }
  absorb_inner_32(local_238,s);
  return;
}

Assistant:

void
Hacl_Hash_SHA3_update_last_sha3(
  Spec_Hash_Definitions_hash_alg a,
  uint64_t *s,
  uint8_t *input,
  uint32_t input_len
)
{
  uint8_t suffix;
  if (a == Spec_Hash_Definitions_Shake128 || a == Spec_Hash_Definitions_Shake256)
  {
    suffix = 0x1fU;
  }
  else
  {
    suffix = 0x06U;
  }
  uint32_t len = block_len(a);
  if (input_len == len)
  {
    uint8_t b1[256U] = { 0U };
    uint8_t *b_ = b1;
    uint8_t *b00 = input;
    uint8_t *bl00 = b_;
    memcpy(bl00, b00 + 0U * len, len * sizeof (uint8_t));
    absorb_inner_32(b_, s);
    uint8_t b2[256U] = { 0U };
    uint8_t *b_0 = b2;
    uint32_t rem = 0U % len;
    uint8_t *b01 = input + input_len;
    uint8_t *bl0 = b_0;
    memcpy(bl0, b01 + 0U - rem, rem * sizeof (uint8_t));
    uint8_t *b02 = b_0;
    b02[0U % len] = suffix;
    uint64_t ws[32U] = { 0U };
    uint8_t *b = b_0;
    uint64_t u = load64_le(b);
    ws[0U] = u;
    uint64_t u0 = load64_le(b + 8U);
    ws[1U] = u0;
    uint64_t u1 = load64_le(b + 16U);
    ws[2U] = u1;
    uint64_t u2 = load64_le(b + 24U);
    ws[3U] = u2;
    uint64_t u3 = load64_le(b + 32U);
    ws[4U] = u3;
    uint64_t u4 = load64_le(b + 40U);
    ws[5U] = u4;
    uint64_t u5 = load64_le(b + 48U);
    ws[6U] = u5;
    uint64_t u6 = load64_le(b + 56U);
    ws[7U] = u6;
    uint64_t u7 = load64_le(b + 64U);
    ws[8U] = u7;
    uint64_t u8 = load64_le(b + 72U);
    ws[9U] = u8;
    uint64_t u9 = load64_le(b + 80U);
    ws[10U] = u9;
    uint64_t u10 = load64_le(b + 88U);
    ws[11U] = u10;
    uint64_t u11 = load64_le(b + 96U);
    ws[12U] = u11;
    uint64_t u12 = load64_le(b + 104U);
    ws[13U] = u12;
    uint64_t u13 = load64_le(b + 112U);
    ws[14U] = u13;
    uint64_t u14 = load64_le(b + 120U);
    ws[15U] = u14;
    uint64_t u15 = load64_le(b + 128U);
    ws[16U] = u15;
    uint64_t u16 = load64_le(b + 136U);
    ws[17U] = u16;
    uint64_t u17 = load64_le(b + 144U);
    ws[18U] = u17;
    uint64_t u18 = load64_le(b + 152U);
    ws[19U] = u18;
    uint64_t u19 = load64_le(b + 160U);
    ws[20U] = u19;
    uint64_t u20 = load64_le(b + 168U);
    ws[21U] = u20;
    uint64_t u21 = load64_le(b + 176U);
    ws[22U] = u21;
    uint64_t u22 = load64_le(b + 184U);
    ws[23U] = u22;
    uint64_t u23 = load64_le(b + 192U);
    ws[24U] = u23;
    uint64_t u24 = load64_le(b + 200U);
    ws[25U] = u24;
    uint64_t u25 = load64_le(b + 208U);
    ws[26U] = u25;
    uint64_t u26 = load64_le(b + 216U);
    ws[27U] = u26;
    uint64_t u27 = load64_le(b + 224U);
    ws[28U] = u27;
    uint64_t u28 = load64_le(b + 232U);
    ws[29U] = u28;
    uint64_t u29 = load64_le(b + 240U);
    ws[30U] = u29;
    uint64_t u30 = load64_le(b + 248U);
    ws[31U] = u30;
    for (uint32_t i = 0U; i < 25U; i++)
    {
      s[i] = s[i] ^ ws[i];
    }
    if (!(((uint32_t)suffix & 0x80U) == 0U) && 0U % len == len - 1U)
    {
      for (uint32_t i0 = 0U; i0 < 24U; i0++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i1,
          0U,
          5U,
          1U,
          uint64_t uu____0 = _C[(i1 + 1U) % 5U];
          uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____0 << 1U | uu____0 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____1 = current;
          s[_Y] = uu____1 << r | uu____1 >> (64U - r);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
        s[0U] = s[0U] ^ c;
      }
    }
    uint8_t b3[256U] = { 0U };
    uint8_t *b4 = b3;
    uint8_t *b0 = b4;
    b0[len - 1U] = 0x80U;
    absorb_inner_32(b4, s);
    return;
  }
  uint8_t b1[256U] = { 0U };
  uint8_t *b_ = b1;
  uint32_t rem = input_len % len;
  uint8_t *b00 = input;
  uint8_t *bl0 = b_;
  memcpy(bl0, b00 + input_len - rem, rem * sizeof (uint8_t));
  uint8_t *b01 = b_;
  b01[input_len % len] = suffix;
  uint64_t ws[32U] = { 0U };
  uint8_t *b = b_;
  uint64_t u = load64_le(b);
  ws[0U] = u;
  uint64_t u0 = load64_le(b + 8U);
  ws[1U] = u0;
  uint64_t u1 = load64_le(b + 16U);
  ws[2U] = u1;
  uint64_t u2 = load64_le(b + 24U);
  ws[3U] = u2;
  uint64_t u3 = load64_le(b + 32U);
  ws[4U] = u3;
  uint64_t u4 = load64_le(b + 40U);
  ws[5U] = u4;
  uint64_t u5 = load64_le(b + 48U);
  ws[6U] = u5;
  uint64_t u6 = load64_le(b + 56U);
  ws[7U] = u6;
  uint64_t u7 = load64_le(b + 64U);
  ws[8U] = u7;
  uint64_t u8 = load64_le(b + 72U);
  ws[9U] = u8;
  uint64_t u9 = load64_le(b + 80U);
  ws[10U] = u9;
  uint64_t u10 = load64_le(b + 88U);
  ws[11U] = u10;
  uint64_t u11 = load64_le(b + 96U);
  ws[12U] = u11;
  uint64_t u12 = load64_le(b + 104U);
  ws[13U] = u12;
  uint64_t u13 = load64_le(b + 112U);
  ws[14U] = u13;
  uint64_t u14 = load64_le(b + 120U);
  ws[15U] = u14;
  uint64_t u15 = load64_le(b + 128U);
  ws[16U] = u15;
  uint64_t u16 = load64_le(b + 136U);
  ws[17U] = u16;
  uint64_t u17 = load64_le(b + 144U);
  ws[18U] = u17;
  uint64_t u18 = load64_le(b + 152U);
  ws[19U] = u18;
  uint64_t u19 = load64_le(b + 160U);
  ws[20U] = u19;
  uint64_t u20 = load64_le(b + 168U);
  ws[21U] = u20;
  uint64_t u21 = load64_le(b + 176U);
  ws[22U] = u21;
  uint64_t u22 = load64_le(b + 184U);
  ws[23U] = u22;
  uint64_t u23 = load64_le(b + 192U);
  ws[24U] = u23;
  uint64_t u24 = load64_le(b + 200U);
  ws[25U] = u24;
  uint64_t u25 = load64_le(b + 208U);
  ws[26U] = u25;
  uint64_t u26 = load64_le(b + 216U);
  ws[27U] = u26;
  uint64_t u27 = load64_le(b + 224U);
  ws[28U] = u27;
  uint64_t u28 = load64_le(b + 232U);
  ws[29U] = u28;
  uint64_t u29 = load64_le(b + 240U);
  ws[30U] = u29;
  uint64_t u30 = load64_le(b + 248U);
  ws[31U] = u30;
  for (uint32_t i = 0U; i < 25U; i++)
  {
    s[i] = s[i] ^ ws[i];
  }
  if (!(((uint32_t)suffix & 0x80U) == 0U) && input_len % len == len - 1U)
  {
    for (uint32_t i0 = 0U; i0 < 24U; i0++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i1,
        0U,
        5U,
        1U,
        uint64_t uu____2 = _C[(i1 + 1U) % 5U];
        uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____2 << 1U | uu____2 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____3 = current;
        s[_Y] = uu____3 << r | uu____3 >> (64U - r);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
      s[0U] = s[0U] ^ c;
    }
  }
  uint8_t b2[256U] = { 0U };
  uint8_t *b3 = b2;
  uint8_t *b0 = b3;
  b0[len - 1U] = 0x80U;
  absorb_inner_32(b3, s);
}